

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

bool __thiscall
FOptionMenuNumberField::MenuEvent(FOptionMenuNumberField *this,int mkey,bool fromcontroller)

{
  FBaseCVar *pFVar1;
  bool bVar2;
  byte extraout_AL;
  byte bVar3;
  float fVar4;
  undefined4 extraout_var;
  UCVarValue vval;
  UCVarValue local_28;
  FSoundID local_1c;
  
  pFVar1 = (this->super_FOptionMenuFieldBase).mCVar;
  if (pFVar1 != (FBaseCVar *)0x0) {
    fVar4 = (float)(*pFVar1->_vptr_FBaseCVar[4])(pFVar1,2);
    if ((mkey == 6) || (mkey == 3)) {
      local_28.Float = fVar4 + this->mStep;
      if (this->mMaximum <= local_28.Float && local_28.Float != this->mMaximum) {
        local_28.Int = (int)this->mMinimum;
      }
LAB_00311182:
      local_28._4_4_ = extraout_var;
      FBaseCVar::SetGenericRep((this->super_FOptionMenuFieldBase).mCVar,local_28,CVAR_Float);
      local_1c.ID = S_FindSound("menu/change");
      S_Sound(0x22,&local_1c,snd_menuvolume.Value,0.0);
      bVar2 = true;
      bVar3 = extraout_AL;
    }
    else {
      if (mkey == 2) {
        local_28.Float = fVar4 - this->mStep;
        if (local_28.Float < this->mMinimum) {
          local_28.Int = (int)this->mMaximum;
        }
        goto LAB_00311182;
      }
      bVar3 = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
      bVar2 = false;
    }
    if (!bVar2) goto LAB_003111df;
  }
  bVar3 = 1;
LAB_003111df:
  return (bool)(bVar3 & 1);
}

Assistant:

bool MenuEvent ( int mkey, bool fromcontroller )
	{
		if ( mCVar )
		{
			float value = mCVar->GetGenericRep( CVAR_Float ).Float;

			if ( mkey == MKEY_Left )
			{
				value -= mStep;

				if ( value < mMinimum )
					value = mMaximum;
			}
			else if ( mkey == MKEY_Right || mkey == MKEY_Enter )
			{
				value += mStep;

				if ( value > mMaximum )
					value = mMinimum;
			}
			else
				return FOptionMenuItem::MenuEvent( mkey, fromcontroller );

			UCVarValue vval;
			vval.Float = value;
			mCVar->SetGenericRep( vval, CVAR_Float );
			S_Sound( CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE );
		}

		return true;
	}